

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_knife(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  CHAR_DATA *pCVar5;
  char *pcVar6;
  CHAR_DATA *in_RDI;
  bool killed;
  AFFECT_DATA af;
  char buf [4608];
  CHAR_DATA *victim;
  char arg [4608];
  undefined4 in_stack_ffffffffffffdb28;
  undefined4 uVar7;
  int in_stack_ffffffffffffdb2c;
  CHAR_DATA *in_stack_ffffffffffffdb30;
  void *arg1;
  undefined4 in_stack_ffffffffffffdb38;
  int in_stack_ffffffffffffdb3c;
  undefined4 in_stack_ffffffffffffdb40;
  undefined4 in_stack_ffffffffffffdb44;
  AFFECT_DATA *in_stack_ffffffffffffdb48;
  CHAR_DATA *in_stack_ffffffffffffdb50;
  undefined4 in_stack_ffffffffffffdb58;
  int in_stack_ffffffffffffdb5c;
  CHAR_DATA *in_stack_ffffffffffffdb60;
  int in_stack_ffffffffffffdc04;
  undefined1 in_stack_ffffffffffffdc0b;
  int in_stack_ffffffffffffdc0c;
  CHAR_DATA *in_stack_ffffffffffffdc10;
  int in_stack_ffffffffffffdc2c;
  CHAR_DATA *in_stack_ffffffffffffdc30;
  int in_stack_ffffffffffffdc3c;
  undefined1 in_stack_ffffffffffffdc42;
  undefined1 in_stack_ffffffffffffdc43;
  int in_stack_ffffffffffffdc44;
  CHAR_DATA *in_stack_ffffffffffffdc48;
  CHAR_DATA *in_stack_ffffffffffffdc50;
  int in_stack_ffffffffffffdc70;
  OBJ_DATA *in_stack_ffffffffffffdc78;
  char *in_stack_ffffffffffffed30;
  CHAR_DATA *in_stack_ffffffffffffed38;
  char local_1218;
  
  one_argument((char *)in_stack_ffffffffffffdb30,
               (char *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28));
  iVar3 = get_skill(in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc2c);
  if (iVar3 != 0) {
    sVar1 = in_RDI->level;
    in_stack_ffffffffffffdb60 = (CHAR_DATA *)(skill_table + gsn_knife);
    this = char_data::Class((char_data *)
                            CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40));
    iVar3 = CClass::GetIndex(this);
    if (*(short *)((long)&in_stack_ffffffffffffdb60->next_in_room + (long)iVar3 * 2) <= sVar1)
    goto LAB_00761e11;
  }
  bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28));
  if (!bVar2) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
    return;
  }
LAB_00761e11:
  if (local_1218 == '\0') {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
  }
  else if (in_RDI->fighting == (CHAR_DATA *)0x0) {
    pCVar5 = get_char_room(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30);
    if (pCVar5 == (CHAR_DATA *)0x0) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
    }
    else if (pCVar5 == in_RDI) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
    }
    else {
      bVar2 = is_wielded((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                         (int)((ulong)in_stack_ffffffffffffdb30 >> 0x20),
                         (int)in_stack_ffffffffffffdb30);
      if (bVar2) {
        bVar2 = is_safe(in_stack_ffffffffffffdb30,
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28));
        if (!bVar2) {
          WAIT_STATE((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40),
                     in_stack_ffffffffffffdb3c);
          bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28))
          ;
          if ((!bVar2) &&
             (bVar2 = is_npc((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28)), !bVar2)
             ) {
            in_stack_ffffffffffffdb5c =
                 number_range((int)in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb2c);
            if (in_stack_ffffffffffffdb5c == 0) {
              in_stack_ffffffffffffdb50 = (CHAR_DATA *)&stack0xffffffffffffdbd8;
              pcVar6 = pers((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                            in_stack_ffffffffffffdb30);
              sprintf((char *)in_stack_ffffffffffffdb50,"Die, %s you knifing fool!",pcVar6);
            }
            else if (in_stack_ffffffffffffdb5c == 1) {
              in_stack_ffffffffffffdb48 = (AFFECT_DATA *)&stack0xffffffffffffdbd8;
              pcVar6 = pers((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                            in_stack_ffffffffffffdb30);
              sprintf((char *)in_stack_ffffffffffffdb48,"Help! %s knifed me!",pcVar6);
            }
            do_myell((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40),
                     (char *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                     in_stack_ffffffffffffdb30);
          }
          iVar3 = number_percent();
          iVar4 = get_skill(in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc2c);
          if (iVar3 < iVar4) {
            act((char *)CONCAT44(iVar3,in_stack_ffffffffffffdb40),
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                in_stack_ffffffffffffdb30,
                (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
            act((char *)CONCAT44(iVar3,in_stack_ffffffffffffdb40),
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                in_stack_ffffffffffffdb30,
                (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
            act((char *)CONCAT44(iVar3,in_stack_ffffffffffffdb40),
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                in_stack_ffffffffffffdb30,
                (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
            uVar7 = 0x7d;
            arg1 = (void *)0x0;
            iVar4 = one_hit_new(in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc48,
                                in_stack_ffffffffffffdc44,(bool)in_stack_ffffffffffffdc43,
                                (bool)in_stack_ffffffffffffdc42,in_stack_ffffffffffffdc3c,
                                in_stack_ffffffffffffdc70,(char *)in_stack_ffffffffffffdc78);
            check_improve(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c,
                          (bool)in_stack_ffffffffffffdc0b,in_stack_ffffffffffffdc04);
            if ((iVar4 == 0) &&
               (iVar4 = number_range((int)arg1,in_stack_ffffffffffffdb2c), iVar4 == 3)) {
              act((char *)CONCAT44(iVar3,in_stack_ffffffffffffdb40),
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),arg1,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,uVar7),0);
              init_affect((AFFECT_DATA *)0x762164);
              new_affect_to_char(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
            }
          }
          else {
            damage(in_stack_ffffffffffffdb60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),
                   (int)((ulong)in_stack_ffffffffffffdb50 >> 0x20),(int)in_stack_ffffffffffffdb50,
                   (int)((ulong)in_stack_ffffffffffffdb48 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffdb48 >> 0x18,0));
            check_improve(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c,
                          (bool)in_stack_ffffffffffffdc0b,in_stack_ffffffffffffdc04);
          }
        }
      }
      else {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
      }
    }
  }
  else {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
  }
  return;
}

Assistant:

void do_knife(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];
	AFFECT_DATA af;

	one_argument(argument, arg);

	if ((get_skill(ch, gsn_knife) == 0) || ch->level < skill_table[gsn_knife].skill_level[ch->Class()->GetIndex()])
	{
		if (!is_npc(ch))
		{
			send_to_char("You don't know how to knife.\n\r", ch);
			return;
		}
	}

	if (arg[0] == '\0')
	{
		send_to_char("Knife whom?\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("No way! You're still fighting!\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Bah, you can't knife yourself.\n\r", ch);
		return;
	}

	if (!is_wielded(ch, WEAPON_DAGGER, WIELD_ONE))
	{
		send_to_char("You need to be wielding a dagger to knife.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	WAIT_STATE(ch, PULSE_VIOLENCE);

	if (!is_npc(ch) && !is_npc(victim))
	{
		switch (number_range(0, 1))
		{
			case 0:
				sprintf(buf, "Die, %s you knifing fool!", pers(ch, victim));
				break;
			case 1:
				sprintf(buf, "Help! %s knifed me!", pers(ch, victim));
				break;
		}

		do_myell(victim, buf, ch);
	}

	if (number_percent() < get_skill(ch, gsn_knife))
	{
		act("You slam your dagger into $N's side!", ch, 0, victim, TO_CHAR);
		act("$n slams $s dagger into your side!", ch, 0, victim, TO_VICT);
		act("$n slams $s dagger into $N's side!", ch, 0, victim, TO_NOTVICT);

		bool killed = one_hit_new(ch, victim, gsn_knife, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 125, nullptr);

		check_improve(ch, gsn_knife, true, 1);

		if (killed)
			return;

		if (number_range(0, 5) == 3)
		{
			act("Bright red blood spurts out of $S wound!\n\r", ch, 0, victim, TO_CHAR);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.duration = ch->level / 8;
			af.type = gsn_bleeding;
			af.level = ch->level;
			af.modifier = 0;
			af.aftype = AFT_INVIS;
			af.tick_fun = bleeding_tick;
			af.owner = ch;
			new_affect_to_char(victim, &af);
		}
	}
	else
	{
		damage(ch, victim, 0, gsn_knife, DAM_NONE, true);
		check_improve(ch, gsn_knife, false, 2);
	}
}